

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getRowsByRange
                   (void *highs,HighsInt from_row,HighsInt to_row,HighsInt *num_row,double *lower,
                   double *upper,HighsInt *num_nz,HighsInt *matrix_start,HighsInt *matrix_index,
                   double *matrix_value)

{
  HighsStatus HVar1;
  undefined4 *in_RCX;
  undefined4 *in_stack_00000008;
  double *in_stack_00000028;
  HighsStatus status;
  HighsInt local_num_nz;
  HighsInt local_num_row;
  HighsInt *in_stack_00000060;
  HighsInt *in_stack_00000068;
  undefined4 local_38;
  undefined4 local_34;
  
  HVar1 = Highs::getRows((Highs *)num_row,lower._4_4_,(HighsInt)lower,(HighsInt *)upper,
                         _local_num_nz,in_stack_00000028,in_stack_00000060,in_stack_00000068,num_nz,
                         (double *)matrix_start);
  *in_RCX = local_34;
  *in_stack_00000008 = local_38;
  return HVar1;
}

Assistant:

HighsInt Highs_getRowsByRange(const void* highs, const HighsInt from_row,
                              const HighsInt to_row, HighsInt* num_row,
                              double* lower, double* upper, HighsInt* num_nz,
                              HighsInt* matrix_start, HighsInt* matrix_index,
                              double* matrix_value) {
  HighsInt local_num_row, local_num_nz;
  HighsStatus status =
      ((Highs*)highs)
          ->getRows(from_row, to_row, local_num_row, lower, upper, local_num_nz,
                    matrix_start, matrix_index, matrix_value);
  *num_row = local_num_row;
  *num_nz = local_num_nz;
  return (HighsInt)status;
}